

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLLinOp::make
          (MLLinOp *this,
          Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
          *mf,IntVect *ng)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long *in_RAX;
  pointer *__ptr;
  int mlev;
  ulong uVar4;
  int alev;
  ulong uVar5;
  long *local_38;
  
  local_38 = in_RAX;
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::clear(&mf->
           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
         );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&mf->
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(long)this->m_num_amr_levels);
  for (uVar5 = 0; (long)uVar5 < (long)this->m_num_amr_levels; uVar5 = uVar5 + 1) {
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              (&(mf->
                super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5].
                super_vector<amrex::Any,_std::allocator<amrex::Any>_>,
               (long)(this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar5]);
    for (uVar4 = 0;
        (long)uVar4 <
        (long)(this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar5]; uVar4 = uVar4 + 1) {
      (*this->_vptr_MLLinOp[0x27])(&local_38,this,uVar5 & 0xffffffff,uVar4 & 0xffffffff,ng);
      plVar3 = local_38;
      lVar1 = *(long *)&(mf->
                        super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                        ).
                        super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].
                        super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
      local_38 = (long *)0x0;
      plVar2 = *(long **)(lVar1 + uVar4 * 8);
      *(long **)(lVar1 + uVar4 * 8) = plVar3;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 0x10))();
      }
    }
  }
  return;
}

Assistant:

void
MLLinOp::make (Vector<Vector<Any> >& mf, IntVect const& ng) const
{
    mf.clear();
    mf.resize(m_num_amr_levels);
    for (int alev = 0; alev < m_num_amr_levels; ++alev)
    {
        mf[alev].resize(m_num_mg_levels[alev]);
        for (int mlev = 0; mlev < m_num_mg_levels[alev]; ++mlev)
        {
            mf[alev][mlev] = AnyMake(alev, mlev, ng);
        }
    }
}